

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
punky::ast::FunctionLiteral::to_string_abi_cxx11_
          (string *__return_storage_ptr__,FunctionLiteral *this)

{
  bool bVar1;
  unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>
  *this_00;
  type this_01;
  ulong uVar2;
  pointer pBVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  reference local_90;
  Identifier *param;
  iterator __end4;
  iterator __begin4;
  vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_> *__range4;
  string param_str;
  string local_40;
  undefined1 local_19;
  FunctionLiteral *local_18;
  FunctionLiteral *this_local;
  string *fn_str;
  
  local_19 = 0;
  local_18 = this;
  this_local = (FunctionLiteral *)__return_storage_ptr__;
  ExprNode::token_literal_abi_cxx11_(&local_40,&this->super_ExprNode);
  std::operator+(__return_storage_ptr__,&local_40,"(");
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_body);
  if (bVar1) {
    bVar1 = std::
            optional<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
            ::has_value(&this->m_params);
    if (bVar1) {
      std::__cxx11::string::string((string *)&__range4);
      this_00 = std::
                optional<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
                ::value(&this->m_params);
      this_01 = std::
                unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>
                ::operator*(this_00);
      __end4 = std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>::begin
                         (this_01);
      param = (Identifier *)
              std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>::end
                        (this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<punky::ast::Identifier_*,_std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>
                                         *)&param), bVar1) {
        local_90 = __gnu_cxx::
                   __normal_iterator<punky::ast::Identifier_*,_std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>
                   ::operator*(&__end4);
        (*(local_90->super_ExprNode).super_AstNode._vptr_AstNode[3])(&local_d0);
        std::operator+(&local_b0,&local_d0,", ");
        std::__cxx11::string::append((string *)&__range4);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        __gnu_cxx::
        __normal_iterator<punky::ast::Identifier_*,_std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>
        ::operator++(&__end4);
      }
      uVar2 = std::__cxx11::string::size();
      if (2 < uVar2) {
        std::__cxx11::string::pop_back();
        std::__cxx11::string::pop_back();
      }
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range4,
                     ") ");
      pBVar3 = std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::
               operator->(&this->m_body);
      (*(pBVar3->super_StmtNode).super_AstNode._vptr_AstNode[3])(&local_130);
      std::operator+(&local_f0,&local_110,&local_130);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&__range4);
    }
    else {
      pBVar3 = std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::
               operator->(&this->m_body);
      (*(pBVar3->super_StmtNode).super_AstNode._vptr_AstNode[3])(&local_170);
      std::operator+(&local_150,") ",&local_170);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionLiteral::to_string() const
{
    std::string fn_str{token_literal() + "("};
    if (m_body)
    {
        if (m_params.has_value())
        {
            std::string param_str;
            for (const auto& param : *m_params.value())
                param_str.append(param.to_string() + ", ");
            if (param_str.size() > 2)
            {
                param_str.pop_back();
                param_str.pop_back();
            }
            fn_str.append(param_str + ") " + m_body->to_string());
        }
        else
            fn_str.append(") " + m_body->to_string());
    }
    return fn_str;
}